

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

bool __thiscall
ON_AerialPhotoCameraPosition::GetOrientationFrame
          (ON_AerialPhotoCameraPosition *this,ON_3dVector *camera_X,ON_3dVector *camera_Y,
          ON_3dVector *camera_Z)

{
  camera_X->x = (this->m_orientation_rotation).m_xform[0][0];
  camera_X->y = (this->m_orientation_rotation).m_xform[1][0];
  camera_X->z = (this->m_orientation_rotation).m_xform[2][0];
  camera_Y->x = (this->m_orientation_rotation).m_xform[0][1];
  camera_Y->y = (this->m_orientation_rotation).m_xform[1][1];
  camera_Y->z = (this->m_orientation_rotation).m_xform[2][1];
  camera_Z->x = (this->m_orientation_rotation).m_xform[0][2];
  camera_Z->y = (this->m_orientation_rotation).m_xform[1][2];
  camera_Z->z = (this->m_orientation_rotation).m_xform[2][2];
  return (bool)((this->m_status & 2) >> 1);
}

Assistant:

bool ON_AerialPhotoCameraPosition::GetOrientationFrame(
  ON_3dVector& camera_X,
  ON_3dVector& camera_Y,
  ON_3dVector& camera_Z
  ) const
{
  camera_X.x = m_orientation_rotation.m_xform[0][0];
  camera_X.y = m_orientation_rotation.m_xform[1][0];
  camera_X.z = m_orientation_rotation.m_xform[2][0];

  camera_Y.x = m_orientation_rotation.m_xform[0][1];
  camera_Y.y = m_orientation_rotation.m_xform[1][1];
  camera_Y.z = m_orientation_rotation.m_xform[2][1];

  camera_Z.x = m_orientation_rotation.m_xform[0][2];
  camera_Z.y = m_orientation_rotation.m_xform[1][2];
  camera_Z.z = m_orientation_rotation.m_xform[2][2];

  return (0 != (m_status & 2));
}